

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

u16 cellSizePtr(MemPage *pPage,u8 *pCell)

{
  byte bVar1;
  uint uVar2;
  byte *pbVar3;
  byte *pbVar4;
  uint local_40;
  uint local_38;
  int minLocal;
  u8 *pEnd;
  byte *pbStack_20;
  u32 nSize;
  u8 *pIter;
  u8 *pCell_local;
  MemPage *pPage_local;
  
  pbStack_20 = pCell + pPage->childPtrSize;
  pIter = pCell;
  pCell_local = &pPage->isInit;
  if (pPage->intKey == '\0') {
    if (*pbStack_20 < 0x80) {
      pEnd._4_4_ = (uint)*pbStack_20;
      local_40 = 1;
    }
    else {
      bVar1 = sqlite3GetVarint32(pbStack_20,(u32 *)((long)&pEnd + 4));
      local_40 = (uint)bVar1;
    }
    pbStack_20 = pbStack_20 + (int)local_40;
  }
  else {
    if (pPage->hasData == '\0') {
      pEnd._4_4_ = 0;
    }
    else {
      if (*pbStack_20 < 0x80) {
        pEnd._4_4_ = (uint)*pbStack_20;
        local_38 = 1;
      }
      else {
        bVar1 = sqlite3GetVarint32(pbStack_20,(u32 *)((long)&pEnd + 4));
        local_38 = (uint)bVar1;
      }
      pbStack_20 = pbStack_20 + (int)local_38;
    }
    pbVar3 = pbStack_20 + 9;
    do {
      pbVar4 = pbStack_20 + 1;
      bVar1 = *pbStack_20;
      pbStack_20 = pbVar4;
    } while ((bVar1 & 0x80) != 0 && pbVar4 < pbVar3);
  }
  if (*(ushort *)(pCell_local + 8) < pEnd._4_4_) {
    uVar2 = (uint)*(ushort *)(pCell_local + 10);
    pEnd._4_4_ = uVar2 + (pEnd._4_4_ - uVar2) %
                         (*(int *)(*(long *)(pCell_local + 0x48) + 0x34) - 4U);
    if (*(ushort *)(pCell_local + 8) < pEnd._4_4_) {
      pEnd._4_4_ = uVar2;
    }
    pEnd._4_4_ = pEnd._4_4_ + 4;
  }
  pEnd._4_4_ = ((int)pbStack_20 - (int)pIter) + pEnd._4_4_;
  if (pEnd._4_4_ < 4) {
    pEnd._4_4_ = 4;
  }
  return (u16)pEnd._4_4_;
}

Assistant:

static u16 cellSizePtr(MemPage *pPage, u8 *pCell){
  u8 *pIter = &pCell[pPage->childPtrSize];
  u32 nSize;

#ifdef SQLITE_DEBUG
  /* The value returned by this function should always be the same as
  ** the (CellInfo.nSize) value found by doing a full parse of the
  ** cell. If SQLITE_DEBUG is defined, an assert() at the bottom of
  ** this function verifies that this invariant is not violated. */
  CellInfo debuginfo;
  btreeParseCellPtr(pPage, pCell, &debuginfo);
#endif

  if( pPage->intKey ){
    u8 *pEnd;
    if( pPage->hasData ){
      pIter += getVarint32(pIter, nSize);
    }else{
      nSize = 0;
    }

    /* pIter now points at the 64-bit integer key value, a variable length 
    ** integer. The following block moves pIter to point at the first byte
    ** past the end of the key value. */
    pEnd = &pIter[9];
    while( (*pIter++)&0x80 && pIter<pEnd );
  }else{
    pIter += getVarint32(pIter, nSize);
  }

  testcase( nSize==pPage->maxLocal );
  testcase( nSize==pPage->maxLocal+1 );
  if( nSize>pPage->maxLocal ){
    int minLocal = pPage->minLocal;
    nSize = minLocal + (nSize - minLocal) % (pPage->pBt->usableSize - 4);
    testcase( nSize==pPage->maxLocal );
    testcase( nSize==pPage->maxLocal+1 );
    if( nSize>pPage->maxLocal ){
      nSize = minLocal;
    }
    nSize += 4;
  }
  nSize += (u32)(pIter - pCell);

  /* The minimum size of any cell is 4 bytes. */
  if( nSize<4 ){
    nSize = 4;
  }

  assert( nSize==debuginfo.nSize );
  return (u16)nSize;
}